

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O3

void linenoise::linenoiseEditBackspace(linenoiseState *l)

{
  byte bVar1;
  int iVar2;
  char *__src;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int end;
  int iVar9;
  
  iVar2 = l->pos;
  if (((long)iVar2 < 1) || (l->len < 1)) {
    return;
  }
  iVar3 = iVar2;
  do {
    if (iVar3 < 1) {
      iVar4 = -1;
    }
    else {
      iVar4 = iVar3 + -1;
    }
    iVar9 = iVar3 - iVar4;
    if (iVar3 == iVar4) {
LAB_00144ebf:
      uVar7 = 0;
    }
    else {
      pbVar5 = (byte *)(l->buf + iVar4);
      bVar1 = *pbVar5;
      uVar7 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar6 = (uint)bVar1;
        if ((uVar7 & 0xffffffe0) == 0xc0) {
          uVar7 = 0;
          if (1 < iVar9) {
            uVar7 = (uVar6 & 0x1f) << 6;
            lVar8 = 1;
LAB_00144f9a:
            uVar7 = pbVar5[lVar8] & 0x3f | uVar7;
          }
        }
        else if ((uVar6 & 0xfffffff0) == 0xe0) {
          uVar7 = 0;
          if (2 < iVar9) {
            uVar7 = (uVar6 & 0xf) << 0xc | (pbVar5[1] & 0x3f) << 6;
            lVar8 = 2;
            goto LAB_00144f9a;
          }
        }
        else {
          if (iVar9 < 4) goto LAB_00144ebf;
          uVar7 = 0;
          if ((uVar6 & 0xfffffff8) == 0xf0) {
            uVar7 = (pbVar5[2] & 0x3f) << 6 | (pbVar5[1] & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
            lVar8 = 3;
            goto LAB_00144f9a;
          }
        }
      }
    }
    lVar8 = 0;
    while (*(ulong *)((long)&unicodeCombiningCharTable + lVar8) != (ulong)uVar7) {
      lVar8 = lVar8 + 8;
      if (lVar8 == 0x30f8) {
        iVar4 = iVar2 - iVar4;
        goto LAB_00144fd9;
      }
    }
    iVar3 = iVar4;
    if (iVar4 < 1) {
      iVar4 = 0;
LAB_00144fd9:
      __src = l->buf + iVar2;
      memmove(__src + -(long)iVar4,__src,(long)(l->len - iVar2));
      l->pos = l->pos - iVar4;
      lVar8 = (long)l->len - (long)iVar4;
      l->len = (int)lVar8;
      l->buf[lVar8] = '\0';
      refreshSingleLine(l);
      return;
    }
  } while( true );
}

Assistant:

inline void linenoiseEditBackspace(struct linenoiseState *l) {
    if (l->pos > 0 && l->len > 0) {
        int glen = unicodePrevGraphemeLen(l->buf,l->pos);
        memmove(l->buf+l->pos-glen,l->buf+l->pos,l->len-l->pos);
        l->pos-=glen;
        l->len-=glen;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}